

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RangeListSyntax *args;
  RangeCoverageBinInitializerSyntax *pRVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor local_22;
  DeepCloneVisitor local_21;
  WithClauseSyntax *local_20;
  
  args = (RangeListSyntax *)
         detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),&local_22,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x20) == (SyntaxNode *)0x0) {
    local_20 = (WithClauseSyntax *)0x0;
  }
  else {
    local_20 = (WithClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x20),&local_21,(BumpAllocator *)__child_stack);
  }
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RangeCoverageBinInitializerSyntax,slang::syntax::RangeListSyntax&,slang::syntax::WithClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_20);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RangeCoverageBinInitializerSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RangeCoverageBinInitializerSyntax>(
        *deepClone<RangeListSyntax>(*node.ranges, alloc),
        node.withClause ? deepClone(*node.withClause, alloc) : nullptr
    );
}